

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::RandomOrderTexImage2DCase::createTexture(RandomOrderTexImage2DCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  deUint32 type;
  int i;
  uint uVar3;
  deUint32 dVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  int width;
  uint uVar8;
  int iVar9;
  int ndx;
  ulong __n;
  float fVar10;
  deUint32 tex;
  int local_104;
  vector<int,_std::allocator<int>_> levels;
  Vec4 gMax;
  TextureFormat fmt;
  Vec4 gMin;
  Random rnd;
  PixelBufferAccess local_98;
  TextureLevel levelData;
  float afStack_40 [4];
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  uVar8 = 1;
  if (((this->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar8 = (this->super_TextureSpecCase).m_width;
    uVar3 = 0x20;
    uVar7 = 0x20;
    if (uVar8 != 0) {
      uVar7 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = uVar7 ^ 0x1f;
    }
    uVar8 = (this->super_TextureSpecCase).m_height;
    if (uVar8 != 0) {
      uVar3 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    iVar9 = 0x1f - uVar3;
    if ((int)(0x1f - uVar3) < (int)(0x1f - uVar7)) {
      iVar9 = 0x1f - uVar7;
    }
    uVar8 = iVar9 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  dVar4 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  __n = (ulong)uVar8;
  std::vector<int,_std::allocator<int>_>::vector(&levels,__n,(allocator_type *)&local_98);
  if (0 < (int)uVar8) {
    uVar6 = 0;
    do {
      levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar6] = (int)uVar6;
      uVar6 = uVar6 + 1;
    } while (__n != uVar6);
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&rnd,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  if (0 < (int)uVar8) {
    uVar6 = 0;
    do {
      local_104 = levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6];
      iVar9 = (this->super_TextureSpecCase).m_height >> ((byte)local_104 & 0x1f);
      local_98.super_ConstPixelBufferAccess.m_format.order = R;
      local_98.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_98.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
      local_98.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
      width = (this->super_TextureSpecCase).m_width >> ((byte)local_104 & 0x1f);
      if (width < 2) {
        width = 1;
      }
      lVar5 = 0;
      do {
        gMax.m_data[lVar5] = 1.0;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      if (iVar9 < 2) {
        iVar9 = 1;
      }
      gMin.m_data[0] = 0.0;
      gMin.m_data[1] = 0.0;
      gMin.m_data[2] = 0.0;
      gMin.m_data[3] = 0.0;
      lVar5 = 0;
      do {
        fVar1 = (float)local_98.super_ConstPixelBufferAccess.m_size.m_data[lVar5 + -2];
        fVar2 = gMax.m_data[lVar5];
        fVar10 = deRandom_getFloat(&rnd.m_rnd);
        gMin.m_data[lVar5] = (fVar2 - fVar1) * fVar10 + fVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      local_98.super_ConstPixelBufferAccess.m_format.order = R;
      local_98.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_98.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
      local_98.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
      lVar5 = 0;
      do {
        afStack_40[lVar5] = 1.0;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      gMax.m_data[0] = 0.0;
      gMax.m_data[1] = 0.0;
      gMax.m_data[2] = 0.0;
      gMax.m_data[3] = 0.0;
      lVar5 = 0;
      do {
        fVar1 = (float)local_98.super_ConstPixelBufferAccess.m_size.m_data[lVar5 + -2];
        fVar2 = afStack_40[lVar5];
        fVar10 = deRandom_getFloat(&rnd.m_rnd);
        gMax.m_data[lVar5] = (fVar2 - fVar1) * fVar10 + fVar1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      tcu::TextureLevel::setSize(&levelData,width,iVar9,1);
      tcu::TextureLevel::getAccess(&local_98,&levelData);
      tcu::fillWithComponentGradients(&local_98,&gMin,&gMax);
      dVar4 = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_98,&levelData);
      sglr::ContextWrapper::glTexImage2D
                (this_00,0xde1,local_104,dVar4,width,iVar9,0,dVar4,type,
                 local_98.super_ConstPixelBufferAccess.m_data);
      uVar6 = uVar6 + 1;
    } while (uVar6 != __n);
  }
  if (levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)levels.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(fmt);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		vector<int>			levels		(numLevels);

		for (int i = 0; i < numLevels; i++)
			levels[i] = i;
		rnd.shuffle(levels.begin(), levels.end());

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelNdx	= levels[ndx];
			int		levelW		= de::max(1, m_width	>> levelNdx);
			int		levelH		= de::max(1, m_height	>> levelNdx);
			Vec4	gMin		= randomVector<4>(rnd);
			Vec4	gMax		= randomVector<4>(rnd);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, levelNdx, m_format, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}